

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_line.cpp
# Opt level: O2

void arrow_line_x_validate(Am_Web_Events *events)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  Am_Slot_Key AVar4;
  int value;
  int value_00;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  Am_Value *pAVar9;
  ulong uVar10;
  ostream *poVar11;
  char *pcVar12;
  Am_Object self;
  int local_50;
  int local_4c;
  Am_Style ls;
  int local_3c;
  Am_Slot slot;
  
  Am_Web_Events::Start(events);
  slot = Am_Web_Events::Get(events);
  Am_Slot::Get_Owner((Am_Slot *)&ls);
  Am_Object::Am_Object(&self,(Am_Object *)&ls);
  Am_Object::~Am_Object((Am_Object *)&ls);
  pAVar9 = Am_Object::Get(&self,0x8b,0);
  value = Am_Value::operator_cast_to_int(pAVar9);
  pAVar9 = Am_Object::Get(&self,0x8d,0);
  value_00 = Am_Value::operator_cast_to_int(pAVar9);
  pAVar9 = Am_Object::Get(&self,100,0);
  iVar5 = Am_Value::operator_cast_to_int(pAVar9);
  pAVar9 = Am_Object::Get(&self,0x66,0);
  iVar6 = Am_Value::operator_cast_to_int(pAVar9);
  pAVar9 = Am_Object::Get(&self,0x90,0);
  iVar7 = Am_Value::operator_cast_to_int(pAVar9);
  pAVar9 = Am_Object::Get(&self,0x91,0);
  iVar8 = Am_Value::operator_cast_to_int(pAVar9);
  pAVar9 = Am_Object::Get(&self,0x6b,0);
  Am_Style::Am_Style(&ls,pAVar9);
  get_thickness_adjustments(&ls,&local_50,&local_4c,&local_3c);
  if (iVar8 < iVar7) {
    iVar8 = iVar7;
  }
  local_50 = local_50 + iVar8;
  local_4c = local_4c + iVar8;
  local_3c = local_3c + iVar8 * 2;
  bVar2 = false;
  bVar3 = false;
  while( true ) {
    bVar1 = Am_Web_Events::Last(events);
    if (bVar1) {
      if (bVar3) {
        Am_Object::Set(&self,0x8b,value,0);
        Am_Object::Set(&self,0x8d,value_00,0);
      }
      if (bVar2) {
        Am_Object::Set(&self,100,iVar5,0);
        Am_Object::Set(&self,0x66,iVar6,0);
      }
      Am_Style::~Am_Style(&ls);
      Am_Object::~Am_Object(&self);
      return;
    }
    slot = Am_Web_Events::Get(events);
    AVar4 = Am_Slot::Get_Key(&slot);
    uVar10 = (ulong)(AVar4 - 100);
    if (0x2d < AVar4 - 100) break;
    if ((0x300000000080U >> (uVar10 & 0x3f) & 1) == 0) {
      if ((5UL >> (uVar10 & 0x3f) & 1) == 0) {
        if ((0x28000000000U >> (uVar10 & 0x3f) & 1) == 0) break;
        iVar6 = value - value_00;
        iVar5 = value_00;
        if (value < value_00) {
          iVar5 = value;
        }
        iVar5 = iVar5 - local_50;
        if (iVar6 < 0) {
          iVar6 = -iVar6;
        }
        iVar6 = iVar6 + local_3c;
        bVar2 = true;
      }
      else {
        if (value < value_00) {
          value = local_50 + iVar5;
          value_00 = (iVar6 + iVar5) - local_4c;
        }
        else {
          value = (iVar6 + iVar5) - local_4c;
          value_00 = local_50 + iVar5;
        }
        bVar3 = true;
      }
    }
    Am_Web_Events::Next(events);
  }
  poVar11 = std::operator<<((ostream *)&std::cerr,"** Amulet_Error: ");
  poVar11 = std::operator<<(poVar11,"** Bug: unexpected slot in arrow_line_x_validate: ");
  AVar4 = Am_Slot::Get_Key(&slot);
  pcVar12 = Am_Get_Slot_Name(AVar4);
  poVar11 = std::operator<<(poVar11,pcVar12);
  std::endl<char,std::char_traits<char>>(poVar11);
  Am_Error();
}

Assistant:

static void
arrow_line_x_validate(Am_Web_Events &events)
{
  bool x1x2_changed = false;
  bool leftwidth_changed = false;

  events.Start();
  Am_Slot slot = events.Get();
  Am_Object self = slot.Get_Owner();
  int x1 = self.Get(Am_X1);
  int x2 = self.Get(Am_X2);
  int left = self.Get(Am_LEFT);
  int width = self.Get(Am_WIDTH);
  int head_length = self.Get(Am_HEAD_LENGTH);
  int head_width = self.Get(Am_HEAD_WIDTH);
  Am_Style ls = self.Get(Am_LINE_STYLE);
  int lt_adjustment, rb_adjustment, wh_adjustment;
  get_thickness_adjustments(ls, lt_adjustment, rb_adjustment, wh_adjustment);
  if (head_length > head_width) {
    lt_adjustment += head_length;
    rb_adjustment += head_length;
    wh_adjustment += 2 * head_length;
  } else {
    lt_adjustment += head_width;
    rb_adjustment += head_width;
    wh_adjustment += 2 * head_width;
  }
  while (!events.Last()) {
    slot = events.Get();
    //std::cout << "__Line_x_Web " << self << " slot " << slot.Get_Key ()
    //  << " l,w,x1,x2 " << left << " " << width << " " << x1 << " " << x2
    //	 <<std::endl <<std::flush;
    switch (slot.Get_Key()) {
    case Am_X1:
    case Am_X2:
      left = imin(x1, x2) - lt_adjustment;
      width = iabs(x2 - x1) + wh_adjustment;
      leftwidth_changed = true;
      //std::cout << "__  left " << left << " width " << width <<std::endl <<std::flush;
      break;
    case Am_LEFT:
    case Am_WIDTH:
      if (x1 < x2) {
        x1 = left + lt_adjustment;
        x2 = left + width - rb_adjustment;
      } else {
        x1 = left + width - rb_adjustment;
        x2 = left + lt_adjustment;
      }
      x1x2_changed = true;
      //std::cout << "__  x1 " << x1 << " x2 " << x2 <<std::endl <<std::flush;
      break;
    case Am_LINE_STYLE:
    case Am_HEAD_WIDTH:
    case Am_HEAD_LENGTH:
      break;
    default:
      Am_ERROR("** Bug: unexpected slot in arrow_line_x_validate: "
               << Am_Get_Slot_Name(slot.Get_Key()));
    }
    events.Next();
  }

  if (x1x2_changed) {
    self.Set(Am_X1, x1);
    self.Set(Am_X2, x2);
  }

  if (leftwidth_changed) {
    self.Set(Am_LEFT, left);
    self.Set(Am_WIDTH, width);
  }
}